

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

int NULLC::TypeSize(int *a)

{
  ExternTypeInfo *pEVar1;
  uint uVar2;
  
  if (a == (int *)0x0) {
    uVar2 = 0;
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*a);
    uVar2 = pEVar1->size;
  }
  return uVar2;
}

Assistant:

int NULLC::TypeSize(int* a)
{
	if(!a)
	{
		nullcThrowError("ERROR: null pointer access");
		return 0;
	}

	return linker->exTypes[*a].size;
}